

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_store_indirect *s)

{
  Register *pRVar1;
  Expression *pEVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint16_t b;
  uint uVar6;
  ushort uVar7;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ast::Instruction::check_alignment((Instruction *)s);
  pRVar1 = s->rn;
  uVar6 = pRVar1->n;
  if (7 < uVar6) {
    std::__cxx11::string::string((string *)&local_b0,"Invalid register",&local_d1);
    error_report(&pRVar1->location,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar6 = s->rn->n;
  }
  uVar5 = s->ldst & 1;
  b = (ushort)(uVar6 << 4) |
      (ushort)(uVar5 << 0xb) | (ushort)((s->ldst & 2) << 0xc) | (ushort)s->rd->n;
  if (s->constant == (Expression *)0x0) {
    b = b | (short)s->rm->n * 0x80 + 0x1000U;
  }
  else {
    iVar3 = (*s->constant->_vptr_Expression[3])();
    if ((char)iVar3 != '\0') {
      pEVar2 = s->constant;
      if (pEVar2->type == LABEL) {
        std::__cxx11::string::string
                  ((string *)&local_d0,"Can\'t be a label, must be a constant",&local_d1);
        error_report(&pEVar2->location,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      else if (pEVar2->type == ABSOLUTE) {
        uVar6 = pEVar2->value;
        uVar4 = uVar6 & 0xffff;
        if (uVar5 == 0) {
          if (0xf < (ushort)uVar6) {
            string_printf_abi_cxx11_
                      (&local_70,
                       "Expression\'s value / 2 = %d (0x%x) not encodable in %d bit,truncate to %d (0x%x)"
                       ,(ulong)uVar4,(ulong)uVar4,3,(ulong)(uVar6 & 7),uVar6 & 7);
            warning_report(&pEVar2->location,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
          if ((uVar6 & 1) != 0) {
            pEVar2 = s->constant;
            string_printf_abi_cxx11_
                      (&local_90,"Expression\'s value = %d (0x%x) must be an even value",
                       (ulong)uVar4,(ulong)uVar4);
            warning_report(&pEVar2->location,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
          }
          uVar7 = (ushort)(uVar6 << 6);
        }
        else {
          if (7 < (ushort)uVar6) {
            string_printf_abi_cxx11_
                      (&local_50,
                       "Expression\'s value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)"
                       ,(ulong)uVar4,(ulong)uVar4,3,(ulong)(uVar6 & 7),uVar6 & 7);
            warning_report(&pEVar2->location,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          uVar7 = (ushort)(uVar4 << 7);
        }
        b = b | uVar7 & 0x380;
      }
    }
  }
  ast::Sections::write16(*(uint *)&s->field_0x40,*(uint *)&s->field_0x44,b);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_store_indirect *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");
	auto byte = s->ldst & 1;
	auto code = ((s->ldst & 2) ? STR_INDIRECT_OPCODE : LDR_INDIRECT_OPCODE)
			| (byte << LDR_STR_INDIRECT_BYTE_INDICATION_POSITION)
			| (s->rd->n << RD_POSITION) | (s->rn->n << RN_POSITION);
	if (s->constant == nullptr) {
		code |= (1 << LDR_STR_INDIRECT_REG_INDICATION_POSITION) + (s->rm->n << RM_POSITION);
	} else if (s->constant->evaluate()) {
		auto constant_type = s->constant->get_type();
		if (constant_type == ABSOLUTE) {
			auto constant_value = s->constant->get_value();
			if (constant_value < 0) {
				error_report(&s->constant->location,"Expression's value must a positive number");
			}
			else {
				if (byte) {
					if ((constant_value & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf("Expression's value = %d (0x%x) not encodable in %d bit,"
									" truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
				else {
					if (((constant_value / 2) & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf( "Expression's value / 2 = %d (0x%x) not encodable in %d bit,"
									"truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					if ((constant_value & 1) != 0)
						warning_report(&s->constant->location, string_printf(
							"Expression's value = %d (0x%x) must be an even value", constant_value, constant_value));
					constant_value /= 2;
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
			}
		}
		else if (constant_type == Value_type::LABEL)
			error_report(&s->constant->location,"Can't be a label, must be a constant");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}